

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O3

int __thiscall
axl::sl::StringBase<char,_axl::sl::StringDetailsBase<char>_>::copy
          (StringBase<char,_axl::sl::StringDetailsBase<char>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  EVP_PKEY_CTX EVar1;
  BufHdr *pBVar2;
  C *pCVar3;
  int iVar4;
  EVP_PKEY_CTX *src_00;
  
  if (dst == (EVP_PKEY_CTX *)this) {
    src_00 = (EVP_PKEY_CTX *)
             (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length;
  }
  else {
    src_00 = *(EVP_PKEY_CTX **)(dst + 0x10);
    if (src_00 == (EVP_PKEY_CTX *)0x0) {
      pBVar2 = (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_hdr;
      if (pBVar2 != (BufHdr *)0x0) {
        if ((pBVar2->super_RefCount).m_refCount == 1) {
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p =
               (C *)(pBVar2 + 1);
          *(undefined1 *)&pBVar2[1].super_RefCount._vptr_RefCount = 0;
          (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = 0;
        }
        else {
          StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::release
                    (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>);
        }
      }
      src_00 = (EVP_PKEY_CTX *)0x0;
    }
    else {
      pBVar2 = *(BufHdr **)(dst + 8);
      if (((pBVar2 == (BufHdr *)0x0) || ((pBVar2->m_flags & 4) != 0)) ||
         (EVar1 = dst[0x18], EVar1 == (EVP_PKEY_CTX)0x0)) {
        iVar4 = copy(this,*(EVP_PKEY_CTX **)dst,src_00);
        return iVar4;
      }
      pCVar3 = *(C **)dst;
      StringRefBase<char,_axl::sl::StringDetailsBase<char>_>::attachBufHdr
                (&this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>,pBVar2);
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_p = pCVar3;
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_length = (size_t)src_00
      ;
      (this->super_StringRefBase<char,_axl::sl::StringDetailsBase<char>_>).m_isNullTerminated =
           (bool)EVar1;
    }
  }
  return (int)src_00;
}

Assistant:

size_t
	copy(const StringRef& src) {
		if (&src == this)
			return this->m_length;

		if (src.isEmpty()) {
			clear();
			return 0;
		}

		rc::BufHdr* hdr = src.getHdr();
		if (!hdr || (hdr->m_flags & rc::BufHdrFlag_Exclusive) || !src.isNullTerminated())
			return copy(src.cp(), src.getLength());

		this->attach(src);
		return this->m_length;
	}